

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_infix(FuncState *fs,BinOpr op,expdesc *v)

{
  int iVar1;
  int dummy2;
  int dummy;
  int local_20;
  int local_1c;
  
  luaK_dischargevars(fs,v);
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    if ((v->t != v->f) || (1 < v->k - VKFLT)) {
      luaK_exp2anyreg(fs,v);
      return;
    }
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(fs,v);
    return;
  case OPR_EQ:
  case OPR_NE:
    if ((v->t != v->f) || (1 < v->k - VKFLT)) {
      exp2RK(fs,v);
      return;
    }
    break;
  case OPR_LT:
  case OPR_LE:
  case OPR_GT:
  case OPR_GE:
    iVar1 = isSCnumber(v,&local_1c,&local_20);
    if (iVar1 == 0) {
      luaK_exp2anyreg(fs,v);
    }
    break;
  case OPR_AND:
    luaK_goiftrue(fs,v);
    return;
  case OPR_OR:
    luaK_goiffalse(fs,v);
    return;
  }
  return;
}

Assistant:

void luaK_infix (FuncState *fs, BinOpr op, expdesc *v) {
  luaK_dischargevars(fs, v);
  switch (op) {
    case OPR_AND: {
      luaK_goiftrue(fs, v);  /* go ahead only if 'v' is true */
      break;
    }
    case OPR_OR: {
      luaK_goiffalse(fs, v);  /* go ahead only if 'v' is false */
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2nextreg(fs, v);  /* operand must be on the stack */
      break;
    }
    case OPR_ADD: case OPR_SUB:
    case OPR_MUL: case OPR_DIV: case OPR_IDIV:
    case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      if (!tonumeral(v, NULL))
        luaK_exp2anyreg(fs, v);
      /* else keep numeral, which may be folded or used as an immediate
         operand */
      break;
    }
    case OPR_EQ: case OPR_NE: {
      if (!tonumeral(v, NULL))
        exp2RK(fs, v);
      /* else keep numeral, which may be an immediate operand */
      break;
    }
    case OPR_LT: case OPR_LE:
    case OPR_GT: case OPR_GE: {
      int dummy, dummy2;
      if (!isSCnumber(v, &dummy, &dummy2))
        luaK_exp2anyreg(fs, v);
      /* else keep numeral, which may be an immediate operand */
      break;
    }
    default: lua_assert(0);
  }
}